

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# afcjk.c
# Opt level: O3

FT_Error af_cjk_metrics_init(AF_CJKMetrics metrics,FT_Face face)

{
  ushort uVar1;
  AF_Blue_Stringset AVar2;
  FT_CharMap charmap;
  FT_GlyphSlot_conflict pFVar3;
  FT_Vector *pFVar4;
  int iVar5;
  char cVar6;
  FT_Error FVar7;
  AF_Blue_String AVar8;
  long *buf_;
  AF_CJKAxisRec *pAVar9;
  AF_CJKBlueRec *pAVar10;
  ulong uVar11;
  AF_Blue_StringRec *pAVar12;
  long lVar13;
  int iVar14;
  int iVar15;
  long lVar16;
  uint uVar17;
  long lVar18;
  uint uVar19;
  long lVar20;
  int iVar21;
  char *pcVar22;
  long lVar23;
  FT_Pos *pFVar24;
  FT_Vector *pFVar25;
  bool bVar26;
  FT_Pos flats [51];
  long local_238;
  FT_Pos fills [51];
  uint local_54;
  ulong local_50;
  ulong local_48;
  long *local_40;
  undefined4 local_34;
  char *p;
  
  charmap = face->charmap;
  metrics->units_per_em = (uint)face->units_per_EM;
  FVar7 = FT_Select_Charmap(face,FT_ENCODING_UNICODE);
  if (FVar7 == 0) {
    af_cjk_metrics_init_widths(metrics,face);
    AVar2 = ((metrics->root).style_class)->blue_stringset;
    buf_ = (long *)ft_mem_alloc(face->memory,8,(FT_Error *)&local_238);
    AVar8 = af_blue_stringsets[AVar2].string;
    if (AVar8 != AF_BLUE_STRING_MAX) {
      pAVar12 = af_blue_stringsets + AVar2;
      local_40 = buf_;
      do {
        fills[0x32] = (FT_Pos)pAVar12;
        uVar1 = pAVar12->properties;
        pAVar9 = metrics->axis;
        if ((uVar1 & 2) == 0) {
          pAVar9 = metrics->axis + 1;
        }
        cVar6 = af_blue_strings[AVar8];
        if (cVar6 != '\0') {
          local_34 = 0x268601;
          local_50 = 0;
          local_48 = 0;
          p = af_blue_strings + AVar8;
          do {
            while (pcVar22 = p + 1, cVar6 == ' ') {
              p = pcVar22;
              cVar6 = *pcVar22;
            }
            if (cVar6 == '|') {
              local_34 = 0;
            }
            else {
              pcVar22 = af_shaper_get_cluster(p,&metrics->root,buf_,&local_54);
              if ((((local_54 < 2) && (*buf_ != 0)) &&
                  (FVar7 = FT_Load_Glyph(face,(FT_UInt)*buf_,1), buf_ = local_40, FVar7 == 0)) &&
                 (pFVar3 = face->glyph, 2 < (pFVar3->outline).n_points)) {
                lVar16 = (long)(pFVar3->outline).n_contours;
                if (lVar16 < 1) {
                  lVar18 = 0;
                }
                else {
                  pFVar4 = (pFVar3->outline).points;
                  iVar21 = -1;
                  lVar13 = 0;
                  iVar15 = 0;
                  lVar18 = 0;
                  do {
                    iVar14 = (int)(pFVar3->outline).contours[lVar13];
                    if (iVar15 < iVar14) {
                      lVar23 = (long)iVar15;
                      lVar20 = (iVar14 - lVar23) + 1;
                      if ((uVar1 & 2) == 0) {
                        if ((uVar1 & 1) == 0) {
                          pFVar24 = &pFVar4[lVar23].y;
                          do {
                            lVar23 = *pFVar24;
                            iVar5 = iVar15;
                            if (lVar18 <= *pFVar24 && -1 < iVar21) {
                              lVar23 = lVar18;
                              iVar5 = iVar21;
                            }
                            iVar21 = iVar5;
                            lVar18 = lVar23;
                            iVar15 = iVar15 + 1;
                            pFVar24 = pFVar24 + 2;
                            lVar20 = lVar20 + -1;
                          } while (lVar20 != 0);
                        }
                        else {
                          pFVar24 = &pFVar4[lVar23].y;
                          do {
                            lVar23 = *pFVar24;
                            iVar5 = iVar15;
                            if (*pFVar24 <= lVar18 && -1 < iVar21) {
                              lVar23 = lVar18;
                              iVar5 = iVar21;
                            }
                            iVar21 = iVar5;
                            lVar18 = lVar23;
                            iVar15 = iVar15 + 1;
                            pFVar24 = pFVar24 + 2;
                            lVar20 = lVar20 + -1;
                          } while (lVar20 != 0);
                        }
                      }
                      else if ((uVar1 & 1) == 0) {
                        pFVar25 = pFVar4 + lVar23;
                        do {
                          lVar23 = pFVar25->x;
                          iVar5 = iVar15;
                          if (lVar18 <= pFVar25->x && -1 < iVar21) {
                            lVar23 = lVar18;
                            iVar5 = iVar21;
                          }
                          iVar21 = iVar5;
                          lVar18 = lVar23;
                          iVar15 = iVar15 + 1;
                          pFVar25 = pFVar25 + 1;
                          lVar20 = lVar20 + -1;
                        } while (lVar20 != 0);
                      }
                      else {
                        pFVar25 = pFVar4 + lVar23;
                        do {
                          lVar23 = pFVar25->x;
                          iVar5 = iVar15;
                          if (pFVar25->x <= lVar18 && -1 < iVar21) {
                            lVar23 = lVar18;
                            iVar5 = iVar21;
                          }
                          iVar21 = iVar5;
                          lVar18 = lVar23;
                          iVar15 = iVar15 + 1;
                          pFVar25 = pFVar25 + 1;
                          lVar20 = lVar20 + -1;
                        } while (lVar20 != 0);
                      }
                    }
                    iVar15 = iVar14 + 1;
                    lVar13 = lVar13 + 1;
                  } while (lVar13 != lVar16);
                }
                if ((char)local_34 == '\0') {
                  uVar11 = local_48 & 0xffffffff;
                  local_48 = (ulong)((int)local_48 + 1);
                  flats[uVar11 - 1] = lVar18;
                  local_34 = 0;
                  buf_ = local_40;
                }
                else {
                  uVar11 = local_50 & 0xffffffff;
                  local_50 = (ulong)((int)local_50 + 1);
                  fills[uVar11 - 1] = lVar18;
                  buf_ = local_40;
                }
              }
            }
            cVar6 = *pcVar22;
            p = pcVar22;
          } while (cVar6 != '\0');
          uVar17 = (uint)local_48;
          uVar19 = (uint)local_50;
          if (uVar17 != 0 || uVar19 != 0) {
            if (1 < uVar19) {
              uVar11 = 1;
              lVar16 = 0;
              do {
                lVar18 = fills[uVar11 - 1];
                lVar13 = lVar16;
                do {
                  if (fills[lVar13 + -1] <= lVar18) break;
                  fills[lVar13] = fills[lVar13 + -1];
                  fills[lVar13 + -1] = lVar18;
                  bVar26 = lVar13 != 0;
                  lVar13 = lVar13 + -1;
                } while (bVar26);
                uVar11 = uVar11 + 1;
                lVar16 = lVar16 + 1;
              } while (uVar11 != (local_50 & 0xffffffff));
            }
            if (uVar17 < 2) {
              pAVar10 = pAVar9->blues + pAVar9->blue_count;
              pAVar9->blue_count = pAVar9->blue_count + 1;
              if (uVar17 != 0) goto LAB_00237e19;
              lVar16 = fills[(ulong)(uVar19 >> 1) - 1];
LAB_00237e77:
              (pAVar10->shoot).org = lVar16;
              (pAVar10->ref).org = lVar16;
            }
            else {
              uVar11 = 1;
              lVar16 = 0;
              do {
                lVar18 = flats[uVar11 - 1];
                lVar13 = lVar16;
                do {
                  if (flats[lVar13 + -1] <= lVar18) break;
                  flats[lVar13] = flats[lVar13 + -1];
                  flats[lVar13 + -1] = lVar18;
                  bVar26 = lVar13 != 0;
                  lVar13 = lVar13 + -1;
                } while (bVar26);
                uVar11 = uVar11 + 1;
                lVar16 = lVar16 + 1;
              } while (uVar11 != (local_48 & 0xffffffff));
              pAVar10 = pAVar9->blues + pAVar9->blue_count;
              pAVar9->blue_count = pAVar9->blue_count + 1;
LAB_00237e19:
              if (uVar19 == 0) {
                lVar16 = flats[(ulong)(uVar17 >> 1) - 1];
                goto LAB_00237e77;
              }
              lVar16 = fills[(ulong)(uVar19 >> 1) - 1];
              (pAVar10->ref).org = lVar16;
              lVar18 = flats[(ulong)(uVar17 >> 1) - 1];
              (pAVar10->shoot).org = lVar18;
              if ((lVar18 != lVar16) && (((lVar16 <= lVar18 ^ (byte)uVar1) & 1) == 0)) {
                lVar16 = (lVar18 + lVar16) / 2;
                goto LAB_00237e77;
              }
            }
            pAVar10->flags = (uint)uVar1 * 2 & 2;
          }
        }
        AVar8 = *(AF_Blue_String *)(fills[0x32] + 8);
        pAVar12 = (AF_Blue_StringRec *)(fills[0x32] + 8);
      } while (AVar8 != AF_BLUE_STRING_MAX);
    }
    ft_mem_free(face->memory,buf_);
    af_cjk_metrics_check_digits(metrics,face);
  }
  FT_Set_Charmap(face,charmap);
  return 0;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  af_cjk_metrics_init( AF_CJKMetrics  metrics,
                       FT_Face        face )
  {
    FT_CharMap  oldmap = face->charmap;


    metrics->units_per_em = face->units_per_EM;

    if ( !FT_Select_Charmap( face, FT_ENCODING_UNICODE ) )
    {
      af_cjk_metrics_init_widths( metrics, face );
      af_cjk_metrics_init_blues( metrics, face );
      af_cjk_metrics_check_digits( metrics, face );
    }

    FT_Set_Charmap( face, oldmap );
    return FT_Err_Ok;
  }